

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_closed_set_normalizer.cc
# Opt level: O2

void __thiscall
s2builderutil::NormalizeClosedSetImpl::Build
          (NormalizeClosedSetImpl *this,int dimension,Graph *g,S2Error *error)

{
  int iVar1;
  __uniq_ptr_data<S2Builder::Layer,_std::default_delete<S2Builder::Layer>,_true,_true> _Var2;
  vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *__x;
  int dim;
  long lVar3;
  long lVar4;
  vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> output;
  vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> local_38;
  
  S2Builder::Graph::operator=
            ((this->graphs_).super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>
             ._M_impl.super__Vector_impl_data._M_start + dimension,g);
  iVar1 = this->graphs_left_;
  this->graphs_left_ = iVar1 + -1;
  if (iVar1 < 2) {
    __x = ClosedSetNormalizer::Run(&this->normalizer_,&this->graphs_,error);
    std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::vector(&local_38,__x);
    lVar4 = 0;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      _Var2.super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>._M_t.
      super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
      super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
           (this->output_layers_).
           super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar3]._M_t.
           super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>;
      (**(code **)(*(long *)_Var2.
                            super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                            .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl + 0x18))
                (_Var2.
                 super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
                 super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl,
                 (long)&((local_38.
                          super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>.
                          _M_impl.super__Vector_impl_data._M_start)->options_).edge_type_ + lVar4,
                 error);
      lVar4 = lVar4 + 0x68;
    }
    std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::~vector(&local_38);
  }
  return;
}

Assistant:

void Build(int dimension, const Graph& g, S2Error* error) {
    // Errors are reported only on the last layer built.
    graphs_[dimension] = g;
    if (--graphs_left_ > 0) return;

    vector<Graph> output = normalizer_.Run(graphs_, error);
    for (int dim = 0; dim < 3; ++dim) {
      output_layers_[dim]->Build(output[dim], error);
    }
  }